

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O3

reference __thiscall
absl::lts_20250127::container_internal::
raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::io::Printer::ValueImpl<true>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::io::Printer::ValueImpl<true>_>_>_>
::iterator::operator*(iterator *this)

{
  long *plVar1;
  __index_type _Var2;
  ctrl_t *pcVar3;
  _Move_ctor_base<false,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
  *__rhs;
  long *plVar4;
  long lVar5;
  undefined8 *in_RCX;
  long *in_RSI;
  undefined8 *in_R8;
  
  pcVar3 = this->ctrl_;
  if (pcVar3 == (ctrl_t *)0x0) {
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,google::protobuf::io::Printer::ValueImpl<true>>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::io::Printer::ValueImpl<true>>>>
    ::iterator::operator*((iterator *)this);
  }
  else {
    in_RCX = (undefined8 *)(kEmptyGroup + 0x10);
    if (pcVar3 != kEmptyGroup + 0x10) {
      if (kSentinel < *pcVar3) {
        return (reference)(this->field_1).slot_;
      }
      goto LAB_00b18ba6;
    }
  }
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,google::protobuf::io::Printer::ValueImpl<true>>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::io::Printer::ValueImpl<true>>>>
  ::iterator::operator*((iterator *)this);
LAB_00b18ba6:
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,google::protobuf::io::Printer::ValueImpl<true>>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::io::Printer::ValueImpl<true>>>>
  ::iterator::operator*((iterator *)this);
  in_RCX = (undefined8 *)*in_RCX;
  __rhs = (_Move_ctor_base<false,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
           *)*in_R8;
  *in_RSI = (long)(in_RSI + 2);
  plVar1 = in_RCX + 2;
  if ((long *)*in_RCX == plVar1) {
    lVar5 = in_RCX[3];
    in_RSI[2] = *plVar1;
    in_RSI[3] = lVar5;
  }
  else {
    *in_RSI = (long)*in_RCX;
    in_RSI[2] = *plVar1;
  }
  in_RSI[1] = in_RCX[1];
  *in_RCX = plVar1;
  in_RCX[1] = 0;
  *(undefined1 *)(in_RCX + 2) = 0;
  std::__detail::__variant::
  _Move_ctor_base<false,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
  ::_Move_ctor_base((_Move_ctor_base<false,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
                     *)(in_RSI + 4),__rhs);
  in_RSI[9] = (long)(in_RSI + 0xb);
  plVar4 = *(long **)&__rhs[1].
                      super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>
                      .
                      super__Variant_storage_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>
                      ._M_u;
  plVar1 = (long *)((long)&__rhs[1].
                           super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>
                           .
                           super__Variant_storage_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>
                           ._M_u._M_rest + 0x10);
  if (plVar4 == plVar1) {
    lVar5 = *(long *)((long)&__rhs[1].
                             super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>
                             .
                             super__Variant_storage_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>
                             ._M_u + 0x18);
    in_RSI[0xb] = *plVar1;
    in_RSI[0xc] = lVar5;
  }
  else {
    in_RSI[9] = (long)plVar4;
    in_RSI[0xb] = *plVar1;
  }
  in_RSI[10] = *(long *)((long)&__rhs[1].
                                super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>
                                .
                                super__Variant_storage_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>
                                ._M_u + 8);
  *(long **)&__rhs[1].
             super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
             super__Variant_storage_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>
             ._M_u = plVar1;
  *(undefined8 *)
   ((long)&__rhs[1].
           super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
           super__Variant_storage_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
           _M_u + 8) = 0;
  __rhs[1].super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
  super__Variant_storage_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>._M_u.
  _M_first._M_storage._M_storage[0x10] = '\0';
  _Var2 = __rhs[1].super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>
          .super__Variant_storage_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
          _M_index;
  *(__index_type *)(in_RSI + 0xd) = _Var2;
  return (reference)CONCAT71((int7)((ulong)plVar1 >> 8),_Var2);
}

Assistant:

reference operator*() const {
      AssertIsFull(ctrl_, generation(), generation_ptr(), "operator*()");
      return unchecked_deref();
    }